

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

string * wabt::(anonymous_namespace)::MakeDollarName_abi_cxx11_(string_view name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  string *psVar4;
  string *extraout_RAX;
  string *extraout_RAX_00;
  long *in_RDI;
  ulong uVar5;
  undefined8 uVar6;
  string local_78;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  string_view local_38;
  
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"$","");
  string_view::to_string_abi_cxx11_(&local_78,&local_38);
  uVar5 = 0xf;
  if (local_58 != local_48) {
    uVar5 = local_48[0];
  }
  if (uVar5 < local_78._M_string_length + local_50) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar6 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_50 <= (ulong)uVar6) {
      psVar4 = (string *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_58);
      goto LAB_00145c1c;
    }
  }
  psVar4 = (string *)
           std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
LAB_00145c1c:
  *in_RDI = (long)(in_RDI + 2);
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  paVar1 = &psVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    lVar3 = *(long *)((long)&psVar4->field_2 + 8);
    in_RDI[2] = paVar1->_M_allocated_capacity;
    in_RDI[3] = lVar3;
  }
  else {
    *in_RDI = (long)pcVar2;
    in_RDI[2] = paVar1->_M_allocated_capacity;
  }
  in_RDI[1] = psVar4->_M_string_length;
  (psVar4->_M_dataplus)._M_p = (pointer)paVar1;
  psVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
    psVar4 = extraout_RAX;
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
    psVar4 = extraout_RAX_00;
  }
  return psVar4;
}

Assistant:

static std::string MakeDollarName(string_view name) {
  return std::string("$") + name.to_string();
}